

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_lscbx(DisasContext_conflict10 *ctx)

{
  TCGTemp *ret;
  TCGContext_conflict10 *s;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 arg;
  uint uVar1;
  TCGTemp *a3;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  uintptr_t o_6;
  uintptr_t o_4;
  uintptr_t o_1;
  uintptr_t o_7;
  uintptr_t o;
  TCGv_i64 ret_00;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s = ctx->uc->tcg_ctx;
  a3 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)a3 - (long)s);
  pTVar2 = tcg_const_i32_ppc64(s,ctx->opcode >> 0x15 & 0x1f);
  pTVar3 = tcg_const_i32_ppc64(s,*(ushort *)((long)&ctx->opcode + 2) & 0x1f);
  pTVar4 = tcg_const_i32_ppc64(s,ctx->opcode >> 0xb & 0x1f);
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0x10 & 0x1f;
  arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar1 == 0) {
    if (ctx->sf_mode == false) {
      tcg_gen_ext32u_i64_ppc64(tcg_ctx,ret_00,arg);
    }
    else if (arg != ret_00) {
      tcg_gen_op2_ppc64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)((long)tcg_ctx + (long)ret_00),
                        (TCGArg)(arg + (long)tcg_ctx));
    }
  }
  else {
    tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_add_i64,(TCGArg)((long)tcg_ctx + (long)ret_00),
                      (TCGArg)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[uVar1]),
                      (TCGArg)(arg + (long)tcg_ctx));
    if (ctx->sf_mode == false) {
      tcg_gen_ext32u_i64_ppc64(tcg_ctx,ret_00,ret_00);
    }
  }
  local_58 = (TCGTemp *)(s->cpu_env + (long)s);
  ret = (TCGTemp *)((long)s + (long)ret_00);
  local_50 = ret;
  local_48 = (TCGTemp *)(pTVar2 + (long)s);
  local_40 = (TCGTemp *)(pTVar3 + (long)s);
  local_38 = (TCGTemp *)(pTVar4 + (long)s);
  tcg_gen_callN_ppc64(s,helper_lscbx_ppc64,ret,5,&local_58);
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar2 + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar3 + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar4 + (long)s));
  tcg_gen_andi_i64_ppc64(s,cpu_xer,cpu_xer,-0x80);
  tcg_gen_op3_ppc64(s,INDEX_op_or_i64,(TCGArg)(cpu_xer + (long)s),(TCGArg)(cpu_xer + (long)s),
                    (TCGArg)a3);
  if ((ctx->opcode & 1) != 0) {
    uVar1._0_1_ = ctx->sf_mode;
    uVar1._1_1_ = ctx->has_cfar;
    uVar1._2_1_ = ctx->fpu_enabled;
    uVar1._3_1_ = ctx->altivec_enabled;
    gen_set_Rc0((DisasContext_conflict10 *)(ulong)uVar1,(TCGv_i64)ctx->uc->tcg_ctx);
  }
  tcg_temp_free_internal_ppc64(s,ret);
  return;
}

Assistant:

static void gen_lscbx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv_i32 t1 = tcg_const_i32(tcg_ctx, rD(ctx->opcode));
    TCGv_i32 t2 = tcg_const_i32(tcg_ctx, rA(ctx->opcode));
    TCGv_i32 t3 = tcg_const_i32(tcg_ctx, rB(ctx->opcode));

    gen_addr_reg_index(ctx, t0);
    gen_helper_lscbx(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1, t2, t3);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
    tcg_gen_andi_tl(tcg_ctx, cpu_xer, cpu_xer, ~0x7F);
    tcg_gen_or_tl(tcg_ctx, cpu_xer, cpu_xer, t0);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t0);
    }
    tcg_temp_free(tcg_ctx, t0);
}